

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

int Acb_ObjComputePathD(Acb_Ntk_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int local_2c;
  int local_28;
  int Path;
  int k;
  int iFanin;
  int *pFanins;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  local_2c = 0;
  iVar1 = Acb_ObjIsCi(p,iObj);
  if (iVar1 != 0) {
    __assert_fail("!Acb_ObjIsCi(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbUtil.c"
                  ,0xb2,"int Acb_ObjComputePathD(Acb_Ntk_t *, int)");
  }
  local_28 = 0;
  piVar3 = Acb_ObjFanins(p,iObj);
  for (; local_28 < *piVar3; local_28 = local_28 + 1) {
    iVar1 = piVar3[local_28 + 1];
    iVar2 = Acb_ObjSlack(p,iVar1);
    if (iVar2 == 0) {
      iVar1 = Acb_ObjPathD(p,iVar1);
      local_2c = iVar1 + local_2c;
    }
  }
  iVar1 = Acb_ObjSetPathD(p,iObj,local_2c);
  return iVar1;
}

Assistant:

int Acb_ObjComputePathD( Acb_Ntk_t * p, int iObj )
{
    int * pFanins, iFanin, k, Path = 0;
    assert( !Acb_ObjIsCi(p, iObj) );
    Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
        if ( !Acb_ObjSlack(p, iFanin) )
            Path += Acb_ObjPathD(p, iFanin);
    return Acb_ObjSetPathD( p, iObj, Path );
}